

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

int ImGui::RoundScalarWithFormatT<int,int>(char *format,ImGuiDataType data_type,int v)

{
  char *pcVar1;
  char cVar2;
  char *src;
  double dVar3;
  char v_str [64];
  undefined4 local_4c;
  char local_48 [64];
  
  cVar2 = *format;
  while( true ) {
    if (cVar2 == '\0') {
      return v;
    }
    if ((cVar2 == '%') && (format[1] != '%')) break;
    format = format + (ulong)(cVar2 == '%') + 1;
    cVar2 = *format;
  }
  local_4c = v;
  ImFormatString(local_48,0x40,format,v);
  src = (char *)((long)&local_4c + 3);
  do {
    pcVar1 = src + 1;
    src = src + 1;
  } while (*pcVar1 == ' ');
  if ((data_type & 0xfffffffeU) == 8) {
    dVar3 = atof(src);
    local_4c = (int)dVar3;
  }
  else {
    ImAtoi<int>(src,&local_4c);
  }
  return local_4c;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}